

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3BeginWriteOperation(Parse *pParse,int setStatement,int iDb)

{
  byte in_DL;
  byte in_SIL;
  Parse *in_RDI;
  Parse *pToplevel;
  int in_stack_ffffffffffffffdc;
  
  if (in_RDI->pToplevel != (Parse *)0x0) {
    in_RDI = in_RDI->pToplevel;
  }
  sqlite3CodeVerifySchemaAtToplevel(in_RDI,in_stack_ffffffffffffffdc);
  in_RDI->writeMask = 1 << (in_DL & 0x1f) | in_RDI->writeMask;
  in_RDI->isMultiWrite = in_RDI->isMultiWrite | in_SIL;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3BeginWriteOperation(Parse *pParse, int setStatement, int iDb){
  Parse *pToplevel = sqlite3ParseToplevel(pParse);
  sqlite3CodeVerifySchemaAtToplevel(pToplevel, iDb);
  DbMaskSet(pToplevel->writeMask, iDb);
  pToplevel->isMultiWrite |= setStatement;
}